

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_cons_viscous_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,REF_DBL re,
          REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t __size;
  double rho;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_NODE pRVar5;
  REF_GRID ref_grid_00;
  uint uVar6;
  REF_DBL *hessian;
  ulong uVar7;
  REF_DBL *hessian_00;
  REF_DBL *hessian_01;
  REF_DBL *hessian_02;
  REF_DBL *pRVar8;
  long lVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  undefined8 uVar12;
  REF_STATUS RVar13;
  double *pdVar14;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  double dVar18;
  REF_DBL reference_temp_k;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double local_78;
  REF_DBL local_70;
  REF_GRID local_68;
  REF_DBL RStack_60;
  double local_58;
  REF_DBL mu_t;
  undefined1 local_48 [16];
  
  pRVar5 = ref_grid->node;
  RVar13 = 2;
  uVar6 = pRVar5->max;
  uVar11 = (ulong)uVar6;
  if ((int)uVar6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbca,
           "ref_metric_cons_viscous_g","malloc rhou1star of REF_DBL negative");
    RVar13 = 1;
  }
  else {
    __size = uVar11 * 0x30;
    local_70 = reference_temp;
    local_68 = ref_grid;
    hessian = (REF_DBL *)malloc(__size);
    if (hessian == (REF_DBL *)0x0) {
      pcVar16 = "malloc rhou1star of REF_DBL NULL";
      uVar12 = 0xbca;
    }
    else {
      uVar17 = (ulong)(uVar6 * 6);
      for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
        hessian[uVar7] = 0.0;
      }
      hessian_00 = (REF_DBL *)malloc(__size);
      if (hessian_00 == (REF_DBL *)0x0) {
        pcVar16 = "malloc rhou2star of REF_DBL NULL";
        uVar12 = 0xbcb;
      }
      else {
        for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
          hessian_00[uVar7] = 0.0;
        }
        hessian_01 = (REF_DBL *)malloc(__size);
        if (hessian_01 == (REF_DBL *)0x0) {
          pcVar16 = "malloc rhou3star of REF_DBL NULL";
          uVar12 = 0xbcc;
        }
        else {
          for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
            hessian_01[uVar7] = 0.0;
          }
          hessian_02 = (REF_DBL *)malloc(__size);
          if (hessian_02 == (REF_DBL *)0x0) {
            pcVar16 = "malloc rhoestar of REF_DBL NULL";
            uVar12 = 0xbcd;
          }
          else {
            for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
              hessian_02[uVar7] = 0.0;
            }
            pRVar8 = (REF_DBL *)malloc(uVar11 * 8);
            ref_grid_00 = local_68;
            if (pRVar8 != (REF_DBL *)0x0) {
              for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                pRVar8[uVar7] = 0.0;
              }
              lVar9 = (long)(ldim / 2);
              pRVar10 = prim_dual + lVar9 + 1;
              for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                if (-1 < pRVar5->global[uVar7]) {
                  pRVar8[uVar7] = *pRVar10;
                }
                pRVar10 = pRVar10 + ldim;
              }
              uVar6 = ref_recon_signed_hessian(local_68,pRVar8,hessian,reconstruction);
              if (uVar6 == 0) {
                uVar7 = 0;
                uVar11 = (ulong)(uint)pRVar5->max;
                if (pRVar5->max < 1) {
                  uVar11 = uVar7;
                }
                pRVar10 = prim_dual + lVar9 + 2;
                for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                  if (-1 < pRVar5->global[uVar7]) {
                    pRVar8[uVar7] = *pRVar10;
                  }
                  pRVar10 = pRVar10 + ldim;
                }
                uVar6 = ref_recon_signed_hessian(ref_grid_00,pRVar8,hessian_00,reconstruction);
                if (uVar6 == 0) {
                  uVar7 = 0;
                  uVar11 = (ulong)(uint)pRVar5->max;
                  if (pRVar5->max < 1) {
                    uVar11 = uVar7;
                  }
                  pRVar10 = prim_dual + lVar9 + 3;
                  for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                    if (-1 < pRVar5->global[uVar7]) {
                      pRVar8[uVar7] = *pRVar10;
                    }
                    pRVar10 = pRVar10 + ldim;
                  }
                  uVar6 = ref_recon_signed_hessian(ref_grid_00,pRVar8,hessian_01,reconstruction);
                  if (uVar6 == 0) {
                    uVar7 = 0;
                    uVar11 = (ulong)(uint)pRVar5->max;
                    if (pRVar5->max < 1) {
                      uVar11 = uVar7;
                    }
                    pRVar10 = prim_dual + lVar9 + 4;
                    for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                      if (-1 < pRVar5->global[uVar7]) {
                        pRVar8[uVar7] = *pRVar10;
                      }
                      pRVar10 = pRVar10 + ldim;
                    }
                    uVar6 = ref_recon_signed_hessian(ref_grid_00,pRVar8,hessian_02,reconstruction);
                    if (uVar6 == 0) {
                      free(pRVar8);
                      pRVar8 = prim_dual + 5;
                      pdVar14 = g + 4;
                      lVar9 = 5;
                      lVar15 = 0;
                      reference_temp_k = local_70;
                      do {
                        if (pRVar5->max <= lVar15) {
                          free(hessian_02);
                          free(hessian_01);
                          free(hessian_00);
                          free(hessian);
                          return 0;
                        }
                        if (-1 < pRVar5->global[lVar15]) {
                          rho = pRVar8[-5];
                          dVar1 = pRVar8[-4];
                          local_68 = (REF_GRID)pRVar8[-3];
                          RStack_60 = pRVar8[-2];
                          local_58 = pRVar8[-1] / 0.3999999999999999;
                          uVar6 = viscosity_law((pRVar8[-1] * 1.4) / rho,reference_temp_k,&local_78)
                          ;
                          if (uVar6 != 0) {
                            uVar11 = (ulong)uVar6;
                            pcVar16 = "sutherlands";
                            uVar12 = 0xbee;
                            goto LAB_001d4ce1;
                          }
                          if ((ldim & 0xfffffffeU) == 0xc) {
                            uVar6 = ref_phys_mut_sa(*pRVar8,rho,local_78 / rho,&mu_t);
                            if (uVar6 != 0) {
                              uVar11 = (ulong)uVar6;
                              pcVar16 = "eddy viscosity";
                              uVar12 = 0xbf2;
                              goto LAB_001d4ce1;
                            }
                            auVar22._8_8_ = mu_t;
                            auVar22._0_8_ = local_78;
                            auVar22 = divpd(auVar22,_DAT_00218dd0);
                            local_48._8_4_ = auVar22._8_4_;
                            local_48._0_8_ = auVar22._8_8_ + auVar22._0_8_;
                            local_48._12_4_ = auVar22._12_4_;
                            local_78 = local_78 + mu_t;
                          }
                          else {
                            local_48._8_8_ = 0;
                            local_48._0_8_ = local_78 / 0.2879999999999999;
                          }
                          dVar18 = RStack_60 * RStack_60 +
                                   dVar1 * dVar1 + (double)local_68 * (double)local_68;
                          dVar2 = hessian_02[lVar9 + -2];
                          dVar3 = hessian_02[lVar9 + -5];
                          dVar4 = hessian_02[lVar9];
                          dVar23 = (((double)local_48._0_8_ * (mach / re)) / rho) *
                                   (dVar3 + dVar2 + dVar4);
                          local_78 = local_78 * (mach / re);
                          dVar19 = (local_78 * 0.3333333333333333) / rho;
                          dVar21 = (RStack_60 * hessian_02[lVar9 + -3] +
                                    (double)local_68 * hessian_02[lVar9 + -4] +
                                    dVar1 * 3.0 * dVar4 + dVar1 * 4.0 * dVar3 + dVar1 * 3.0 * dVar2
                                   + hessian[lVar9] * 3.0 +
                                     hessian[lVar9 + -5] * 4.0 + hessian[lVar9 + -2] * 3.0 +
                                     hessian_00[lVar9 + -4] + hessian_01[lVar9 + -3]) * dVar19;
                          dVar20 = dVar19 * (hessian_02[lVar9 + -1] * RStack_60 +
                                             dVar4 * (double)local_68 * 3.0 +
                                             dVar2 * (double)local_68 * 4.0 +
                                             hessian_02[lVar9 + -4] * dVar1 +
                                             (double)local_68 * 3.0 * dVar3 +
                                            hessian_00[lVar9] * 3.0 +
                                            hessian_00[lVar9 + -2] * 4.0 +
                                            hessian_00[lVar9 + -5] * 3.0 + hessian[lVar9 + -4] +
                                            hessian_01[lVar9 + -1]);
                          dVar19 = dVar19 * (hessian_01[lVar9] * 4.0 +
                                             hessian_01[lVar9 + -2] * 3.0 +
                                             hessian_01[lVar9 + -5] * 3.0 +
                                             hessian[lVar9 + -3] + hessian_00[lVar9 + -1] +
                                            RStack_60 * 4.0 * dVar4 +
                                            RStack_60 * 3.0 * dVar2 +
                                            RStack_60 * 3.0 * dVar3 +
                                            hessian_02[lVar9 + -3] * dVar1 +
                                            (double)local_68 * hessian_02[lVar9 + -1]);
                          pdVar14[-4] = (dVar18 - (rho * 0.5 * dVar18 + local_58) / rho) * dVar23 +
                                        dVar19 * -RStack_60 +
                                        (dVar20 * -(double)local_68 - dVar1 * dVar21) + pdVar14[-4];
                          pdVar14[-3] = -dVar1 * dVar23 + dVar21 + pdVar14[-3];
                          pdVar14[-2] = pdVar14[-2] + (dVar20 - dVar23 * (double)local_68);
                          pdVar14[-1] = pdVar14[-1] + (dVar19 - dVar23 * RStack_60);
                          *pdVar14 = dVar23 + *pdVar14;
                          reference_temp_k = local_70;
                        }
                        lVar15 = lVar15 + 1;
                        pdVar14 = pdVar14 + 5;
                        pRVar8 = pRVar8 + ldim;
                        lVar9 = lVar9 + 6;
                      } while( true );
                    }
                    uVar11 = (ulong)uVar6;
                    pcVar16 = "h4";
                    uVar12 = 0xbe3;
                  }
                  else {
                    uVar11 = (ulong)uVar6;
                    pcVar16 = "h3";
                    uVar12 = 0xbde;
                  }
                }
                else {
                  uVar11 = (ulong)uVar6;
                  pcVar16 = "h2";
                  uVar12 = 0xbd9;
                }
              }
              else {
                uVar11 = (ulong)uVar6;
                pcVar16 = "h1";
                uVar12 = 0xbd4;
              }
LAB_001d4ce1:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,uVar12,"ref_metric_cons_viscous_g",uVar11,pcVar16);
              return (REF_STATUS)uVar11;
            }
            pcVar16 = "malloc lam of REF_DBL NULL";
            uVar12 = 0xbce;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar12
           ,"ref_metric_cons_viscous_g",pcVar16);
  }
  return RVar13;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_viscous_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node;
  REF_INT nequ;
  REF_DBL *lam, *rhou1star, *rhou2star, *rhou3star, *rhoestar;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu, u1, u2, u3, q2, e;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;
  REF_DBL frhou1, frhou2, frhou3, frhoe;
  REF_INT xx = 0, xy = 1, xz = 2, yy = 3, yz = 4, zz = 5;

  nequ = ldim / 2;

  ref_malloc_init(rhou1star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou2star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou3star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhoestar, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);

  var = 1;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou1star, reconstruction), "h1");
  var = 2;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou2star, reconstruction), "h2");
  var = 3;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou3star, reconstruction), "h3");
  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhoestar, reconstruction), "h4");
  ref_free(lam);

  each_ref_node_valid_node(ref_node, node) {
    rho = prim_dual[0 + ldim * node];
    u1 = prim_dual[1 + ldim * node];
    u2 = prim_dual[2 + ldim * node];
    u3 = prim_dual[3 + ldim * node];
    q2 = u1 * u1 + u2 * u2 + u3 * u3;
    e = prim_dual[4 + ldim * node] / (gamma - 1.0) + 0.5 * rho * q2;
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    mu *= mach / re;
    thermal_conductivity *= mach / re;

    frhou1 = 4.0 * rhou1star[xx + 6 * node] + 3.0 * rhou1star[yy + 6 * node] +
             3.0 * rhou1star[zz + 6 * node] + rhou2star[xy + 6 * node] +
             rhou3star[xz + 6 * node];
    frhou1 += 4.0 * u1 * rhoestar[xx + 6 * node] +
              3.0 * u1 * rhoestar[yy + 6 * node] +
              3.0 * u1 * rhoestar[zz + 6 * node] +
              u2 * rhoestar[xy + 6 * node] + u3 * rhoestar[xz + 6 * node];
    frhou1 *= (1.0 / 3.0) * mu / rho;

    frhou2 = rhou1star[xy + 6 * node] + 3.0 * rhou2star[xx + 6 * node] +
             4.0 * rhou2star[yy + 6 * node] + 3.0 * rhou2star[zz + 6 * node] +
             rhou3star[yz + 6 * node];
    frhou2 += u1 * rhoestar[xy + 6 * node] +
              3.0 * u2 * rhoestar[xx + 6 * node] +
              4.0 * u2 * rhoestar[yy + 6 * node] +
              3.0 * u2 * rhoestar[zz + 6 * node] + u3 * rhoestar[yz + 6 * node];
    frhou2 *= (1.0 / 3.0) * mu / rho;

    frhou3 = rhou1star[xz + 6 * node] + rhou2star[yz + 6 * node] +
             3.0 * rhou3star[xx + 6 * node] + 3.0 * rhou3star[yy + 6 * node] +
             4.0 * rhou3star[zz + 6 * node];
    frhou3 += u1 * rhoestar[xz + 6 * node] + u2 * rhoestar[yz + 6 * node] +
              3.0 * u3 * rhoestar[xx + 6 * node] +
              3.0 * u3 * rhoestar[yy + 6 * node] +
              4.0 * u3 * rhoestar[zz + 6 * node];
    frhou3 *= (1.0 / 3.0) * mu / rho;

    frhoe = rhoestar[xx + 6 * node] + rhoestar[yy + 6 * node] +
            rhoestar[zz + 6 * node];
    frhoe *= thermal_conductivity / rho;
    /* fun3d e has density in it */
    g[0 + 5 * node] +=
        -u1 * frhou1 - u2 * frhou2 - u3 * frhou3 + (q2 - e / rho) * frhoe;
    g[1 + 5 * node] += frhou1 - u1 * frhoe;
    g[2 + 5 * node] += frhou2 - u2 * frhoe;
    g[3 + 5 * node] += frhou3 - u3 * frhoe;
    g[4 + 5 * node] += frhoe;
  }

  ref_free(rhoestar);
  ref_free(rhou3star);
  ref_free(rhou2star);
  ref_free(rhou1star);

  return REF_SUCCESS;
}